

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predictor_enc.c
# Opt level: O2

void VP8LResidualImage(int width,int height,int bits,int low_effort,uint32_t *argb,
                      uint32_t *argb_scratch,uint32_t *image,int near_lossless_quality,int exact,
                      int used_subtract_green)

{
  int *piVar1;
  uint uVar2;
  bool bVar3;
  byte bVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  int (*paiVar10) [256];
  uint mode;
  long lVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  uint32_t *puVar15;
  int max_quantization;
  uint uVar16;
  int iVar17;
  int iVar18;
  ulong uVar19;
  uint uVar20;
  uint uVar21;
  long lVar22;
  uint uVar23;
  uint uVar24;
  uint32_t *puVar25;
  uint32_t *puVar26;
  uint uVar27;
  int (*paiVar28) [256];
  float fVar29;
  float fVar30;
  float fVar31;
  uint32_t *local_3290;
  uint8_t *tmp8;
  uint8_t *local_3278;
  long local_3268;
  uint8_t *local_3258;
  uint local_3240;
  uint local_323c;
  uint local_3238;
  float local_3234;
  long local_3218;
  int (*local_3200) [256];
  uint32_t local_3138 [64];
  int histo [4] [256];
  int histo_stack_2 [4] [256];
  int histo_stack_1 [4] [256];
  
  bVar4 = (byte)bits;
  uVar5 = 1 << (bVar4 & 0x1f);
  uVar20 = (uVar5 + width) - 1;
  uVar21 = uVar20 >> (bVar4 & 0x1f);
  uVar23 = (uVar5 + height) - 1;
  uVar24 = uVar23 >> (bVar4 & 0x1f);
  max_quantization = 1 << ((char)(near_lossless_quality / -0x14) + 5U & 0x1f);
  if (low_effort == 0) {
    memset(histo,0,0x1000);
    lVar11 = (long)width;
    uVar12 = 0;
    if (0 < (int)(uVar20 >> (bVar4 & 0x1f))) {
      uVar12 = (ulong)uVar21;
    }
    if ((int)(uVar23 >> (bVar4 & 0x1f)) < 1) {
      uVar24 = 0;
    }
    for (uVar7 = 0; uVar7 != uVar24; uVar7 = uVar7 + 1) {
      iVar18 = (int)uVar7 << (bVar4 & 0x1f);
      uVar20 = height - iVar18;
      if ((int)uVar5 < height - iVar18) {
        uVar20 = uVar5;
      }
      lVar8 = uVar7 * (long)(int)uVar21;
      if ((int)uVar20 < 1) {
        uVar20 = 0;
      }
      for (uVar19 = 0; uVar19 != uVar12; uVar19 = uVar19 + 1) {
        iVar6 = (int)uVar19 << (bVar4 & 0x1f);
        uVar27 = width - iVar6;
        uVar23 = uVar27;
        if ((int)uVar5 < (int)uVar27) {
          uVar23 = uVar5;
        }
        local_3238 = 0xff;
        local_323c = 0xff;
        if (uVar19 != 0) {
          local_323c = (uint)*(byte *)((long)image + uVar19 * 4 + lVar8 * 4 + -3);
        }
        if (uVar7 != 0) {
          local_3238 = (uint)*(byte *)((long)image +
                                      uVar19 * 4 + (uVar7 - 1) * (long)(int)uVar21 * 4 + 1);
        }
        uVar16 = (uint)(0 < (int)uVar19 << (bVar4 & 0x1f));
        iVar17 = uVar16 + uVar23;
        lVar13 = (long)(int)(iVar6 - uVar16);
        local_3240 = 0;
        uVar16 = uVar23;
        if ((int)uVar23 < 1) {
          uVar16 = 0;
        }
        local_3200 = histo_stack_2;
        local_3234 = 1e+30;
        puVar15 = argb_scratch + lVar11 + 1;
        puVar25 = argb_scratch;
        paiVar10 = histo_stack_1;
        for (mode = 0; mode != 0xe; mode = mode + 1) {
          memset(paiVar10,0,0x1000);
          if (0 < iVar18) {
            memcpy(puVar15 + lVar13,argb + (iVar18 + -1) * width + lVar13,(long)iVar17 * 4 + 4);
          }
          puVar26 = puVar15;
          for (uVar14 = 0; puVar15 = puVar26, uVar14 != uVar20; uVar14 = uVar14 + 1) {
            lVar22 = uVar14 + (long)iVar18;
            bVar3 = lVar22 < (long)height + -1;
            memcpy(puVar25 + lVar13,argb + lVar13 + lVar22 * lVar11,
                   (long)(int)(iVar17 + (uint)bVar3) << 2);
            if (bVar3 && (0 < lVar22 && 1 < max_quantization)) {
              MaxDiffsForRow((uint)((int)uVar5 < (int)uVar27) + iVar17,width,
                             argb + lVar13 + lVar22 * lVar11,
                             (uint8_t *)((long)(argb_scratch + lVar11 * 2 + 2) + lVar13),
                             used_subtract_green);
            }
            GetResidual(width,height,puVar15,puVar25,(uint8_t *)(argb_scratch + lVar11 * 2 + 2),mode
                        ,iVar6,uVar23 + iVar6,(int)lVar22,max_quantization,exact,used_subtract_green
                        ,local_3138);
            for (uVar9 = 0; uVar16 != uVar9; uVar9 = uVar9 + 1) {
              uVar2 = local_3138[uVar9];
              (*paiVar10)[uVar2 >> 0x18] = (*paiVar10)[uVar2 >> 0x18] + 1;
              piVar1 = (int *)((long)paiVar10[1] + (ulong)(uVar2 >> 0xe & 0x3fc));
              *piVar1 = *piVar1 + 1;
              paiVar10[2][uVar2 >> 8 & 0xff] = paiVar10[2][uVar2 >> 8 & 0xff] + 1;
              paiVar10[3][uVar2 & 0xff] = paiVar10[3][uVar2 & 0xff] + 1;
            }
            puVar26 = puVar25;
            puVar25 = puVar15;
          }
          fVar31 = 0.0;
          for (lVar22 = 0; lVar22 != 0x1000; lVar22 = lVar22 + 0x400) {
            piVar1 = (int *)((long)*paiVar10 + lVar22);
            fVar29 = PredictionCostSpatial(piVar1,1,0.94);
            fVar30 = (*VP8LCombinedShannonEntropy)(piVar1,(int *)((long)histo[0] + lVar22));
            fVar31 = fVar31 + fVar29 + fVar30;
          }
          if (mode == local_323c) {
            fVar31 = fVar31 + -15.0;
          }
          if (mode == local_3238) {
            fVar31 = fVar31 + -15.0;
          }
          paiVar28 = paiVar10;
          if (fVar31 < local_3234) {
            paiVar28 = local_3200;
            local_3240 = mode;
            local_3234 = fVar31;
            local_3200 = paiVar10;
          }
          paiVar10 = paiVar28;
        }
        paiVar10 = histo;
        for (lVar13 = 0; lVar13 != 4; lVar13 = lVar13 + 1) {
          for (lVar22 = 0; lVar22 != 0x100; lVar22 = lVar22 + 1) {
            (*paiVar10)[lVar22] = (*paiVar10)[lVar22] + (*local_3200)[lVar22];
          }
          paiVar10 = paiVar10 + 1;
          local_3200 = local_3200 + 1;
        }
        image[lVar8 + uVar19] = local_3240 << 8 | 0xff000000;
      }
    }
  }
  else {
    uVar24 = uVar24 * uVar21;
    uVar7 = 0;
    uVar12 = (ulong)uVar24;
    if ((int)uVar24 < 1) {
      uVar12 = uVar7;
    }
    for (; uVar12 != uVar7; uVar7 = uVar7 + 1) {
      image[uVar7] = 0xff000b00;
    }
  }
  local_3218 = (long)height;
  local_3268 = (long)width;
  puVar15 = argb_scratch + local_3268 + 1;
  tmp8 = (uint8_t *)(argb_scratch + local_3268 * 2 + 2);
  uVar12 = 0;
  uVar7 = 0;
  if (0 < height) {
    uVar7 = (ulong)(uint)height;
  }
  local_3278 = (uint8_t *)((long)argb_scratch + local_3268 * 9 + 8);
  do {
    puVar26 = (uint32_t *)((uVar12 + 1) * local_3268 * 4 + (long)argb);
    local_3290 = (uint32_t *)(local_3268 * 4 * uVar12 + (long)argb);
    puVar25 = puVar15;
    puVar15 = argb_scratch;
    while( true ) {
      argb_scratch = puVar25;
      if (uVar7 == uVar12) {
        return;
      }
      memcpy(puVar15,local_3290,(long)(int)((uint)((long)(uVar12 + 1) < local_3218) + width) << 2);
      uVar24 = (uint)uVar12;
      if (low_effort == 0) break;
      PredictBatch(0xb,0,uVar24,width,puVar15,argb_scratch,local_3290);
      puVar26 = puVar26 + local_3268;
      local_3290 = local_3290 + local_3268;
      puVar25 = puVar15;
      puVar15 = argb_scratch;
      uVar12 = uVar12 + 1;
    }
    if (max_quantization < 2) {
      local_3258 = local_3278;
    }
    else {
      if ((long)uVar12 < local_3218 + -2) {
        MaxDiffsForRow(width,width,puVar26,tmp8,used_subtract_green);
      }
      local_3258 = tmp8;
      tmp8 = local_3278;
    }
    uVar12 = uVar12 + 1;
    iVar18 = 0;
    while (iVar18 < width) {
      iVar6 = iVar18 + uVar5;
      if (width <= (int)(iVar18 + uVar5)) {
        iVar6 = width;
      }
      GetResidual(width,height,argb_scratch,puVar15,tmp8,
                  (uint)*(byte *)((long)image +
                                 (long)(int)((iVar18 >> (bVar4 & 0x1f)) +
                                            (uVar24 >> (bVar4 & 0x1f)) * uVar21) * 4 + 1),iVar18,
                  iVar6,uVar24,max_quantization,exact,used_subtract_green,local_3290 + iVar18);
      iVar18 = iVar6;
    }
    local_3278 = local_3258;
  } while( true );
}

Assistant:

void VP8LResidualImage(int width, int height, int bits, int low_effort,
                       uint32_t* const argb, uint32_t* const argb_scratch,
                       uint32_t* const image, int near_lossless_quality,
                       int exact, int used_subtract_green) {
  const int tiles_per_row = VP8LSubSampleSize(width, bits);
  const int tiles_per_col = VP8LSubSampleSize(height, bits);
  int tile_y;
  int histo[4][256];
  const int max_quantization = 1 << VP8LNearLosslessBits(near_lossless_quality);
  if (low_effort) {
    int i;
    for (i = 0; i < tiles_per_row * tiles_per_col; ++i) {
      image[i] = ARGB_BLACK | (kPredLowEffort << 8);
    }
  } else {
    memset(histo, 0, sizeof(histo));
    for (tile_y = 0; tile_y < tiles_per_col; ++tile_y) {
      int tile_x;
      for (tile_x = 0; tile_x < tiles_per_row; ++tile_x) {
        const int pred = GetBestPredictorForTile(width, height, tile_x, tile_y,
            bits, histo, argb_scratch, argb, max_quantization, exact,
            used_subtract_green, image);
        image[tile_y * tiles_per_row + tile_x] = ARGB_BLACK | (pred << 8);
      }
    }
  }

  CopyImageWithPrediction(width, height, bits, image, argb_scratch, argb,
                          low_effort, max_quantization, exact,
                          used_subtract_green);
}